

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,4>,tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  bool *pbVar1;
  ostringstream *poVar2;
  float afVar3 [2];
  ostream *poVar4;
  pointer pMVar5;
  pointer pMVar6;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar7;
  pointer pcVar8;
  double dVar9;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar10;
  FloatFormat *pFVar11;
  undefined8 uVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  uint uVar15;
  float afVar16 [2];
  char *__s;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  IVal *pIVar20;
  TestError *this_00;
  bool bVar21;
  TestLog *pTVar22;
  Matrix<float,_2,_4> *pMVar23;
  string *psVar24;
  undefined1 *puVar25;
  undefined8 *puVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  PrecisionCase *pPVar30;
  IVal in2;
  IVal reference1;
  IVal in3;
  ostringstream os;
  Environment env;
  FuncSet funcs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  ostringstream oss;
  undefined1 auStack_598 [8];
  PrecisionCase *local_590;
  string local_588;
  IVal local_559;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_558;
  size_t local_550;
  Statement *local_548;
  ulong local_540;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_4>,_tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_538;
  long local_530;
  FloatFormat *local_528;
  ulong local_520;
  string local_518;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  Vector<float,_2> local_4d8;
  Data local_4d0;
  undefined4 local_4c0;
  ios_base local_488 [8];
  ios_base local_480 [264];
  ulong local_378;
  ResultCollector *local_370;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_368;
  undefined1 local_338 [16];
  undefined1 local_328 [24];
  Vector<float,_2> local_310;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_278;
  FloatFormat local_248;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [24];
  undefined8 local_190 [11];
  ios_base local_138 [264];
  
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_550 = (long)pMVar6 - (long)pMVar5 >> 5;
  local_558 = inputs;
  local_548 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_278,local_550);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_248.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_248.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_248.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_248.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_248.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_248.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_248.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_248.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_248._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_368._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_368._M_impl.super__Rb_tree_header._M_header;
  local_368._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_368._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_368._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4f8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_4f8 + 8);
  local_368._M_impl.super__Rb_tree_header._M_header._M_right =
       local_368._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_548->_vptr_Statement[2])(local_548,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_590 = this;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_480);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  afVar3 = (float  [2])((long)local_338 + 8);
  local_338._8_4_ = _S_red;
  local_328._0_4_ = 0.0;
  local_328._4_4_ = 0.0;
  local_310.m_data[0] = 0.0;
  local_310.m_data[1] = 0.0;
  local_328._8_8_ = afVar3;
  local_328._16_8_ = afVar3;
  (*local_548->_vptr_Statement[4])(local_548,local_338);
  if ((float  [2])local_328._8_8_ != afVar3) {
    afVar16 = (float  [2])local_328._8_8_;
    do {
      (**(code **)(**(long **)((long)afVar16 + 0x20) + 0x30))
                (*(long **)((long)afVar16 + 0x20),local_1a8);
      afVar16 = (float  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)afVar16);
    } while (afVar16 != afVar3);
  }
  pPVar30 = local_590;
  if (local_310.m_data != (float  [2])0x0) {
    local_4f8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_4f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_588._M_dataplus._M_p,local_588._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_588._M_dataplus._M_p != &local_588.field_2) {
      operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_480);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,"precision ",10);
  __s = glu::getPrecisionName((pPVar30->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_598 + (long)((TestLog *)(local_4f8._0_8_ + -0x18))->m_log) + 0xa0)
    ;
  }
  else {
    sVar17 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8,__s,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4f8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
  std::ios_base::~ios_base(local_488);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_590->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  local_538 = variables;
  if ((local_590->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&local_590->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    pTVar22 = (TestLog *)(plVar18 + 2);
    if ((TestLog *)*plVar18 == pTVar22) {
      local_4e8._0_8_ = pTVar22->m_log;
      local_4e8._8_8_ = plVar18[3];
      local_4f8._0_8_ = (TestLog *)local_4e8;
    }
    else {
      local_4e8._0_8_ = pTVar22->m_log;
      local_4f8._0_8_ = (TestLog *)*plVar18;
    }
    local_4f8._8_8_ = plVar18[1];
    *plVar18 = (long)pTVar22;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_4f8);
    if ((TestLog *)local_4f8._0_8_ != (TestLog *)local_4e8) {
      operator_delete((void *)local_4f8._0_8_,(ulong)(local_4e8._0_8_ + 1));
    }
    variables = local_538;
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),2);
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_4f8,local_590,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_4f8);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_4d8);
  glu::VarType::~VarType((VarType *)&local_4d8);
  if ((TestLog *)local_4f8._0_8_ != (TestLog *)local_4e8) {
    operator_delete((void *)local_4f8._0_8_,(ulong)(local_4e8._0_8_ + 1));
  }
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_4f8,local_590,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  uVar12 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_4f8);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_4d8);
  glu::VarType::~VarType((VarType *)&local_4d8);
  if ((TestLog *)local_4f8._0_8_ != (TestLog *)local_4e8) {
    operator_delete((void *)local_4f8._0_8_,(ulong)(local_4e8._0_8_ + 1));
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_4f8,local_590,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  uVar12 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_4f8);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_4d8);
  glu::VarType::~VarType((VarType *)&local_4d8);
  if ((TestLog *)local_4f8._0_8_ != (TestLog *)local_4e8) {
    operator_delete((void *)local_4f8._0_8_,(ulong)(local_4e8._0_8_ + 1));
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4f8);
  (*local_548->_vptr_Statement[2])(local_548,local_4f8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4f8);
  std::ios_base::~ios_base(local_488);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pPVar30 = local_590;
  pSVar19 = ShaderExecUtil::createExecutor
                      ((local_590->m_ctx).renderContext,(local_590->m_ctx).shaderType,
                       (ShaderSpec *)local_220);
  local_4f8._0_8_ =
       (local_558->in0).
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4f8._8_8_ =
       (local_558->in1).
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4e8._0_8_ =
       (local_558->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4e8._8_8_ =
       (local_558->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_278.out0.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_278.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((pPVar30->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_550,local_4f8,local_1a8);
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_4f8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_338);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_368,
             (variables->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_4f8);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_368,
             (variables->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (variables->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_588);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (variables->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_518);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_368,
             (variables->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_338);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_368,
             (variables->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_559);
  if (pMVar6 == pMVar5) {
LAB_007379e3:
    local_4f8._0_8_ = ((pPVar30->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_4f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_528 = &(pPVar30->m_ctx).floatFormat;
    local_370 = &pPVar30->m_status;
    local_378 = local_550 + (local_550 == 0);
    local_530 = 0;
    uVar27 = 0;
    local_540 = 0;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      local_520 = uVar27;
      if ((uVar27 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_590->super_TestCase).super_TestNode.m_testCtx);
      }
      pFVar11 = local_528;
      pVVar10 = local_538;
      pMVar5 = (local_558->in0).
               super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_588.field_2._M_allocated_capacity = 0;
      local_588.field_2._8_8_ = 0;
      local_588._M_dataplus._M_p = (pointer)0x0;
      local_588._M_string_length = 0;
      lVar28 = 0;
      psVar24 = &local_588;
      bVar13 = true;
      do {
        bVar21 = bVar13;
        lVar29 = 0;
        do {
          *(undefined4 *)&(&psVar24->_M_dataplus)[lVar29]._M_p =
               *(undefined4 *)
                ((long)(pMVar5->m_data).m_data[lVar29].m_data + lVar28 * 4 + local_530);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 4);
        lVar28 = 1;
        psVar24 = (string *)((long)&local_588._M_dataplus._M_p + 4);
        bVar13 = false;
      } while (bVar21);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doRound
                ((IVal *)local_338,local_528,(Matrix<float,_2,_4> *)&local_588);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_4f8,pFVar11,(IVal *)local_338);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_368,
                           (pVVar10->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      pFVar11 = local_528;
      puVar25 = local_4f8;
      lVar28 = 0;
      bVar13 = true;
      do {
        bVar21 = bVar13;
        lVar29 = 0;
        do {
          *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[lVar28].m_hi + lVar29) =
               *(undefined8 *)(puVar25 + lVar29 + 0x10);
          dVar9 = *(double *)((long)(puVar25 + lVar29) + 8);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[lVar28].m_hasNaN + lVar29;
          *(undefined8 *)pbVar1 = *(undefined8 *)(puVar25 + lVar29);
          *(double *)(pbVar1 + 8) = dVar9;
          lVar29 = lVar29 + 0x30;
        } while (lVar29 != 0xc0);
        lVar28 = 1;
        puVar25 = local_4e8 + 8;
        bVar13 = false;
      } while (bVar21);
      pMVar5 = (local_558->in1).
               super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_588.field_2._M_allocated_capacity = 0;
      local_588.field_2._8_8_ = 0;
      local_588._M_dataplus._M_p = (char *)0x0;
      local_588._M_string_length = 0;
      lVar28 = 0;
      psVar24 = &local_588;
      bVar13 = true;
      do {
        bVar21 = bVar13;
        lVar29 = 0;
        do {
          *(undefined4 *)&(&psVar24->_M_dataplus)[lVar29]._M_p =
               *(undefined4 *)
                ((long)(pMVar5->m_data).m_data[lVar29].m_data + lVar28 * 4 + local_530);
          lVar29 = lVar29 + 1;
        } while (lVar29 != 4);
        lVar28 = 1;
        psVar24 = (string *)((long)&local_588._M_dataplus._M_p + 4);
        bVar13 = false;
      } while (bVar21);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doRound
                ((IVal *)local_338,local_528,(Matrix<float,_2,_4> *)&local_588);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_4f8,pFVar11,(IVal *)local_338);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_368,
                           (pVVar10->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      puVar25 = local_4f8;
      lVar28 = 0;
      bVar13 = true;
      do {
        bVar21 = bVar13;
        lVar29 = 0;
        do {
          *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[lVar28].m_hi + lVar29) =
               *(undefined8 *)(puVar25 + lVar29 + 0x10);
          dVar9 = *(double *)((long)(puVar25 + lVar29) + 8);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[lVar28].m_hasNaN + lVar29;
          *(undefined8 *)pbVar1 = *(undefined8 *)(puVar25 + lVar29);
          *(double *)(pbVar1 + 8) = dVar9;
          lVar29 = lVar29 + 0x30;
        } while (lVar29 != 0xc0);
        lVar28 = 1;
        puVar25 = local_4e8 + 8;
        bVar13 = false;
      } while (bVar21);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_368,
                 (pVVar10->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_368,
                 (pVVar10->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_4d0.basic.type = (local_590->m_ctx).precision;
      local_4d8.m_data = (float  [2])local_528->m_maxValue;
      local_4f8._0_8_ = *(undefined8 *)local_528;
      local_4f8._8_8_ = *(undefined8 *)&local_528->m_fractionBits;
      local_4e8._0_8_ = *(undefined8 *)&local_528->m_hasInf;
      local_4e8._8_8_ = *(undefined8 *)&local_528->m_exactPrecision;
      local_4c0 = 0;
      local_4d0._8_8_ = &local_368;
      (*local_548->_vptr_Statement[3])(local_548,local_4f8);
      pIVar20 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_368,
                           (pVVar10->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_4f8,&local_248,pIVar20);
      uVar27 = local_520;
      pIVar20 = (IVal *)local_4f8;
      puVar26 = (undefined8 *)local_1a8;
      bVar13 = true;
      do {
        bVar21 = bVar13;
        lVar28 = 0;
        do {
          *(undefined8 *)((long)puVar26 + lVar28 + 0x10) =
               *(undefined8 *)((long)&(pIVar20->m_data).m_data[0].m_data[0].m_hi + lVar28);
          pbVar1 = &(pIVar20->m_data).m_data[0].m_data[0].m_hasNaN + lVar28;
          dVar9 = *(double *)(pbVar1 + 8);
          *(undefined8 *)((long)puVar26 + lVar28) = *(undefined8 *)pbVar1;
          ((undefined8 *)((long)puVar26 + lVar28))[1] = dVar9;
          lVar28 = lVar28 + 0x30;
        } while (lVar28 != 0xc0);
        pIVar20 = (IVal *)(local_4e8 + 8);
        puVar26 = local_190;
        bVar13 = false;
      } while (bVar21);
      bVar13 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_520);
      local_4f8._0_8_ = local_4e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4f8,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_370,bVar13,(string *)local_4f8);
      if ((pointer)local_4f8._0_8_ != (pointer)local_4e8) {
        operator_delete((void *)local_4f8._0_8_,(ulong)(local_4e8._0_8_ + 1));
      }
      pVVar10 = local_538;
      if (!bVar13) {
        uVar15 = (int)local_540 + 1;
        local_540 = (ulong)uVar15;
        if ((int)uVar15 < 0x65) {
          local_4f8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_4f8 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\t",1);
          pVVar7 = (pVVar10->in0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pMVar23 = (Matrix<float,_2,_4> *)local_328;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_338._0_8_ = pMVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4f8 + 8),(char *)local_338._0_8_,
                     CONCAT44(local_338._12_4_,local_338._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4f8 + 8)," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_588,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_558->in0).
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar27),pMVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4f8 + 8),local_588._M_dataplus._M_p,
                     local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4f8 + 8),"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != &local_588.field_2) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_4> *)local_338._0_8_ != (Matrix<float,_2,_4> *)local_328) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4f8 + 8),"\t",1);
          pVVar7 = (pVVar10->in1).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pMVar23 = (Matrix<float,_2,_4> *)local_328;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_338._0_8_ = pMVar23;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4f8 + 8),(char *)local_338._0_8_,
                     CONCAT44(local_338._12_4_,local_338._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4f8 + 8)," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_588,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     ((local_558->in1).
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar27),pMVar23);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_4f8 + 8),local_588._M_dataplus._M_p,
                     local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4f8 + 8),"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != &local_588.field_2) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          if ((Matrix<float,_2,_4> *)local_338._0_8_ != (Matrix<float,_2,_4> *)local_328) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_4f8 + 8),"\t",1);
          pVVar7 = (pVVar10->out0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                   .m_ptr;
          pIVar20 = (IVal *)local_328;
          pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
          local_338._0_8_ = pIVar20;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
          poVar4 = (ostream *)(local_4f8 + 8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_338._0_8_,CONCAT44(local_338._12_4_,local_338._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
          valueToString<tcu::Matrix<float,2,4>>
                    (&local_588,(BuiltinPrecisionTests *)&local_248,
                     (FloatFormat *)
                     (local_278.out0.
                      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar27),
                     (Matrix<float,_2,_4> *)pIVar20);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,local_588._M_dataplus._M_p,local_588._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\tExpected range: ",0x11);
          intervalToString<tcu::Matrix<float,2,4>>
                    (&local_518,(BuiltinPrecisionTests *)&local_248,(FloatFormat *)local_1a8,pIVar20
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,local_518._M_dataplus._M_p,local_518._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_588._M_dataplus._M_p != &local_588.field_2) {
            operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
          }
          if ((IVal *)local_338._0_8_ != (IVal *)local_328) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4f8 + 8));
          std::ios_base::~ios_base(local_480);
        }
      }
      pPVar30 = local_590;
      uVar27 = local_520 + 1;
      local_530 = local_530 + 0x20;
    } while (uVar27 != local_378);
    iVar14 = (int)local_540;
    if (iVar14 < 0x65) {
      if (iVar14 == 0) goto LAB_007379e3;
    }
    else {
      local_4f8._0_8_ = ((local_590->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_4f8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
      std::ostream::operator<<(poVar2,iVar14 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_480);
    }
    local_4f8._0_8_ = ((pPVar30->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_4f8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4f8 + 8));
  std::ios_base::~ios_base(local_480);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_278.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}